

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     TersePrintPrefixToStrings<std::tuple<google_protobuf_FileDescriptorProto*,upb_MessageDef_const*(*)(upb_DefPool*)>,1ul>
               (long t,vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_2)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  PrintWithFallback<google_protobuf_FileDescriptorProto*>
            ((google_protobuf_FileDescriptorProto **)(t + 8),local_188);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_2,&bStack_1b8);
  std::__cxx11::string::~string((string *)&bStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void TersePrintPrefixToStrings(const Tuple& t,
                               std::integral_constant<size_t, I>,
                               Strings* strings) {
  TersePrintPrefixToStrings(t, std::integral_constant<size_t, I - 1>(),
                            strings);
  ::std::stringstream ss;
  UniversalTersePrint(std::get<I - 1>(t), &ss);
  strings->push_back(ss.str());
}